

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

int __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
::ReadUInt(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
           *this,uint lb,uint ub)

{
  uint uVar1;
  ulong local_48 [3];
  ArgList local_30;
  
  uVar1 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
  if (uVar1 < lb || ub <= uVar1) {
    local_48[0] = (ulong)uVar1;
    local_30.types_ = 2;
    local_30.field_1.values_ = (Value *)local_48;
    TextReader<fmt::Locale>::DoReportError
              (this->reader_,(this->reader_->super_ReaderBase).token_,(CStringRef)0x1751c0,&local_30
              );
  }
  return uVar1;
}

Assistant:

int ReadUInt(unsigned lb, unsigned ub) {
    int value = reader_.ReadUInt();
    unsigned unsigned_value = value;
    if (unsigned_value < lb || unsigned_value >= ub)
      reader_.ReportError("integer {} out of bounds", value);
    return value;
  }